

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

bool __thiscall
cmCMakePresetsGraph::ReadProjectPresetsInternal(cmCMakePresetsGraph *this,bool allowNoFiles)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  *presets;
  cmJSONState *state;
  _Rb_tree_header *p_Var1;
  Value **this_00;
  string *path;
  _Base_ptr *pp_Var2;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  char cVar6;
  ExpandMacroResult EVar7;
  uint uVar8;
  uint extraout_EAX;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  pointer ppVar13;
  iterator iVar14;
  size_type sVar15;
  _Base_ptr p_Var16;
  const_iterator cVar17;
  const_iterator cVar18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
  *__range2_3;
  string *psVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  byte bVar20;
  _Base_ptr *local_1a0;
  string installDir;
  pointer local_178;
  char local_169;
  string binaryDir;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  cycleStatus;
  undefined1 local_100 [40];
  MacroExpanderVector local_d8;
  pointer local_b8;
  _Alloc_hider local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0 [8];
  vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> inProgressFiles;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  *__range2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
  *__range2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  *__range2;
  File *file;
  string filename;
  
  psVar19 = &this->SourceDir;
  GetUserFilename(&filename,psVar19);
  inProgressFiles.
  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inProgressFiles.
  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inProgressFiles.
  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = cmsys::SystemTools::FileExists(&filename);
  if (bVar5) {
    bVar5 = ReadJSONFile(this,&filename,User,Root,&inProgressFiles,&file,&this->errors);
  }
  else {
    GetFilename((string *)&cycleStatus,psVar19);
    std::__cxx11::string::operator=((string *)&filename,(string *)&cycleStatus);
    std::__cxx11::string::~string((string *)&cycleStatus);
    bVar5 = cmsys::SystemTools::FileExists(&filename);
    if (!bVar5) {
      if (inProgressFiles.
          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          inProgressFiles.
          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002c759e;
      bVar5 = true;
      if (allowNoFiles) goto LAB_002c60cd;
      cmCMakePresetsErrors::FILE_NOT_FOUND(&filename,&this->parseState);
      goto LAB_002c60cb;
    }
    bVar5 = ReadJSONFile(this,&filename,Project,Root,&inProgressFiles,&file,&this->errors);
  }
  if (bVar5 != false) {
    if (inProgressFiles.
        super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        inProgressFiles.
        super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002c759e:
      __assert_fail("inProgressFiles.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsGraph.cxx"
                    ,0x433,"bool cmCMakePresetsGraph::ReadProjectPresetsInternal(bool)");
    }
    presets = &this->ConfigurePresets;
    bVar5 = anon_unknown.dwarf_bf9ea6::
            ComputePresetInheritance<cmCMakePresetsGraph::ConfigurePreset>(presets,this);
    if ((bVar5) &&
       (bVar5 = anon_unknown.dwarf_bf9ea6::
                ComputePresetInheritance<cmCMakePresetsGraph::ConfigurePreset>(presets,this), bVar5)
       ) {
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var1 = &(this->BuildPresets)._M_t._M_impl.super__Rb_tree_header;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var10 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != p_Var1;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 ::operator[](&cycleStatus,(key_type *)(p_Var10 + 1));
        *pmVar9 = Unvisited;
      }
      local_b8 = (pointer)presets;
      local_a0 = (undefined1  [8])p_Var1;
      for (p_Var10 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (undefined1  [8])p_Var10 != local_a0;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               *)&binaryDir,&cycleStatus);
        bVar5 = anon_unknown.dwarf_bf9ea6::VisitPreset<cmCMakePresetsGraph::BuildPreset>
                          ((BuildPreset *)(p_Var10 + 2),&this->BuildPresets,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            *)&binaryDir,this);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                *)&binaryDir);
        if (!bVar5) goto LAB_002c60be;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      ::~map(&cycleStatus);
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a8 = &(this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var10 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var10 != local_a8; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 ::operator[](&cycleStatus,(key_type *)(p_Var10 + 1));
        *pmVar9 = Unvisited;
      }
      for (p_Var10 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var10 != local_a8; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               *)&binaryDir,&cycleStatus);
        bVar5 = anon_unknown.dwarf_bf9ea6::VisitPreset<cmCMakePresetsGraph::TestPreset>
                          ((TestPreset *)(p_Var10 + 2),&this->TestPresets,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            *)&binaryDir,this);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                *)&binaryDir);
        if (!bVar5) goto LAB_002c60be;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      ::~map(&cycleStatus);
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_b0._M_p = (pointer)&(this->PackagePresets)._M_t._M_impl.super__Rb_tree_header;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var10 = (this->PackagePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var10 != (_Base_ptr)local_b0._M_p; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)
          ) {
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 ::operator[](&cycleStatus,(key_type *)(p_Var10 + 1));
        *pmVar9 = Unvisited;
      }
      for (p_Var10 = (this->PackagePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var10 != (_Base_ptr)local_b0._M_p; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)
          ) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               *)&binaryDir,&cycleStatus);
        bVar5 = anon_unknown.dwarf_bf9ea6::VisitPreset<cmCMakePresetsGraph::PackagePreset>
                          ((PackagePreset *)(p_Var10 + 2),&this->PackagePresets,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            *)&binaryDir,this);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                *)&binaryDir);
        if (!bVar5) goto LAB_002c60be;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      ::~map(&cycleStatus);
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var1 = &(this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header;
      cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var10 = (this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != p_Var1;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 ::operator[](&cycleStatus,(key_type *)(p_Var10 + 1));
        *pmVar9 = Unvisited;
      }
      for (p_Var10 = (this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != p_Var1;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               *)&binaryDir,&cycleStatus);
        bVar5 = anon_unknown.dwarf_bf9ea6::VisitPreset<cmCMakePresetsGraph::WorkflowPreset>
                          ((WorkflowPreset *)(p_Var10 + 2),&this->WorkflowPresets,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            *)&binaryDir,this);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                *)&binaryDir);
        if (!bVar5) goto LAB_002c60be;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      ::~map(&cycleStatus);
      local_100._32_8_ = &(this->ConfigurePresets)._M_t._M_impl.super__Rb_tree_header;
      state = &this->parseState;
      for (ppVar13 = (pointer)(this->ConfigurePresets)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left; ppVar13 != (pointer)local_100._32_8_;
          ppVar13 = (pointer)std::_Rb_tree_increment((_Rb_tree_node_base *)ppVar13)) {
        this_00 = &ppVar13[0xf].second;
        std::optional<cmCMakePresetsGraph::ConfigurePreset>::
        emplace<cmCMakePresetsGraph::ConfigurePreset_const&>
                  ((optional<cmCMakePresetsGraph::ConfigurePreset> *)this_00,
                   (ConfigurePreset *)((long)&ppVar13[1].first.field_2 + 8));
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1a0 = (_Base_ptr *)&ppVar13[0x14].first._M_string_length;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var10 = *(_Base_ptr *)((long)&ppVar13[0x14].first.field_2 + 8);
            p_Var10 != (_Base_ptr)local_1a0; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10))
        {
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                   ::operator[](&cycleStatus,(key_type *)(p_Var10 + 1));
          *pmVar9 = Unvisited;
        }
        local_d8.
        super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.
        super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.
        super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::make_unique<cmCMakePresetsGraphInternal::BaseMacroExpander,cmCMakePresetsGraph&>
                  ((cmCMakePresetsGraph *)&installDir);
        binaryDir._M_dataplus = installDir._M_dataplus;
        installDir._M_dataplus._M_p = (pointer)0x0;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&local_d8,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&binaryDir);
        if (binaryDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)binaryDir._M_dataplus._M_p + 0x10))();
        }
        binaryDir._M_dataplus._M_p = (pointer)0x0;
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        std::
        make_unique<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::ConfigurePreset>,cmCMakePresetsGraph&,cmCMakePresetsGraph::ConfigurePreset_const&>
                  ((cmCMakePresetsGraph *)&installDir,(ConfigurePreset *)this);
        binaryDir._M_dataplus = installDir._M_dataplus;
        installDir._M_dataplus._M_p = (pointer)0x0;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&local_d8,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&binaryDir);
        if (binaryDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)binaryDir._M_dataplus._M_p + 0x10))();
        }
        binaryDir._M_dataplus._M_p = (pointer)0x0;
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        binaryDir._M_dataplus._M_p = (pointer)operator_new(0x20);
        *(undefined ***)binaryDir._M_dataplus._M_p = &PTR_operator___0092ca80;
        *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          **)(binaryDir._M_dataplus._M_p + 8) = &cycleStatus;
        *(Value ***)(binaryDir._M_dataplus._M_p + 0x10) = this_00;
        *(vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
          **)(binaryDir._M_dataplus._M_p + 0x18) =
             (vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
              *)&local_d8;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&local_d8,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&binaryDir);
        if (binaryDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)binaryDir._M_dataplus._M_p + 0x10))();
        }
        for (p_Var11 = *(_Base_ptr *)((long)&ppVar13[0x14].first.field_2 + 8);
            p_Var11 != (_Rb_tree_node_base *)local_1a0;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          if ((char)p_Var11[3]._M_color == _S_black) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                     ::operator[](&cycleStatus,(key_type *)(p_Var11 + 1));
            EVar7 = anon_unknown.dwarf_bf9ea6::VisitEnv
                              ((string *)(p_Var11 + 2),pmVar9,&local_d8,
                               *(int *)(ppVar13[3].first.field_2._M_allocated_capacity + 0x20));
            if (EVar7 == Ignore) {
              std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                        ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)this_00);
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector(&local_d8);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::~map(&cycleStatus);
              goto LAB_002c669d;
            }
            if (EVar7 == Error) {
              cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&ppVar13[1].second,state);
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector(&local_d8);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::~map(&cycleStatus);
              goto LAB_002c66d5;
            }
          }
        }
        p_Var10 = (_Base_ptr)ppVar13[5].first._M_string_length;
        if (p_Var10 == (_Base_ptr)0x0) {
LAB_002c6374:
          std::__cxx11::string::string
                    ((string *)&binaryDir,(string *)(ppVar13[10].first.field_2._M_local_buf + 8));
          EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                            (&binaryDir,&local_d8,
                             *(int *)(ppVar13[3].first.field_2._M_allocated_capacity + 0x20));
          if (EVar7 == Ignore) {
            std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                      ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)this_00);
            local_1a0 = (_Base_ptr *)0x1;
          }
          else if (EVar7 == Error) {
            local_1a0 = (_Base_ptr *)0x0;
          }
          else {
            if (binaryDir._M_string_length != 0) {
              bVar5 = cmsys::SystemTools::FileIsFullPath(&binaryDir);
              if (!bVar5) {
                local_100[0] = 0x2f;
                cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                          (&installDir,psVar19,local_100,&binaryDir);
                std::__cxx11::string::operator=((string *)&binaryDir,(string *)&installDir);
                std::__cxx11::string::~string((string *)&installDir);
              }
              cmsys::SystemTools::CollapseFullPath(&installDir,&binaryDir);
              std::__cxx11::string::operator=((string *)&ppVar13[0x18].second,(string *)&installDir)
              ;
              std::__cxx11::string::~string((string *)&installDir);
              cmsys::SystemTools::ConvertToUnixSlashes((string *)&ppVar13[0x18].second);
            }
            if (*(long *)((long)&ppVar13[0xb].first.field_2 + 8) != 0) {
              std::__cxx11::string::string
                        ((string *)&installDir,(string *)ppVar13[0xb].first.field_2._M_local_buf);
              EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                (&installDir,&local_d8,
                                 *(int *)(ppVar13[3].first.field_2._M_allocated_capacity + 0x20));
              if (EVar7 == Ignore) {
                std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                          ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)this_00);
                local_1a0 = (_Base_ptr *)0x1;
                bVar5 = false;
              }
              else if (EVar7 == Error) {
                bVar5 = false;
                local_1a0 = (_Base_ptr *)0x0;
              }
              else {
                bVar5 = cmsys::SystemTools::FileIsFullPath(&installDir);
                if (!bVar5) {
                  local_169 = '/';
                  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                            ((string *)local_100,psVar19,&local_169,&installDir);
                  std::__cxx11::string::operator=((string *)&installDir,(string *)local_100);
                  std::__cxx11::string::~string((string *)local_100);
                }
                cmsys::SystemTools::CollapseFullPath((string *)local_100,&installDir);
                path = (string *)(ppVar13[0x19].first.field_2._M_local_buf + 8);
                std::__cxx11::string::operator=((string *)path,(string *)local_100);
                std::__cxx11::string::~string((string *)local_100);
                bVar5 = true;
                cmsys::SystemTools::ConvertToUnixSlashes(path);
                local_1a0 = (_Base_ptr *)(ulong)extraout_EAX;
              }
              std::__cxx11::string::~string((string *)&installDir);
              if (!bVar5) goto LAB_002c6675;
            }
            bVar20 = (byte)local_1a0;
            if ((_Base_ptr)ppVar13[10].first._M_dataplus._M_p != (_Base_ptr)0x0) {
              std::__cxx11::string::string((string *)&installDir,(string *)&ppVar13[9].second);
              EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                (&installDir,&local_d8,
                                 *(int *)(ppVar13[3].first.field_2._M_allocated_capacity + 0x20));
              if (EVar7 == Ignore) {
                std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                          ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)this_00);
                local_1a0 = (_Base_ptr *)0x1;
                bVar5 = false;
              }
              else if (EVar7 == Error) {
                bVar5 = false;
                local_1a0 = (_Base_ptr *)0x0;
              }
              else {
                bVar5 = true;
                std::__cxx11::string::_M_assign((string *)(ppVar13 + 0x18));
              }
              bVar20 = (byte)local_1a0;
              std::__cxx11::string::~string((string *)&installDir);
              if (!bVar5) goto LAB_002c6675;
            }
            p_Var11 = (_Rb_tree_node_base *)((long)&ppVar13[0x1a].first.field_2 + 8);
            for (p_Var12 = (_Rb_tree_node_base *)ppVar13[0x1b].first._M_dataplus._M_p;
                p_Var12 != p_Var11; p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)
                ) {
              if ((char)p_Var12[4]._M_color == _S_black) {
                EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                  ((string *)(p_Var12 + 3),&local_d8,
                                   *(int *)(ppVar13[3].first.field_2._M_allocated_capacity + 0x20));
                if (EVar7 == Ignore) {
                  std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                            ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)this_00
                            );
                  local_1a0 = (_Base_ptr *)0x1;
                  goto LAB_002c6675;
                }
                if (EVar7 == Error) {
                  bVar20 = 0;
                  break;
                }
              }
            }
            local_1a0 = (_Base_ptr *)(ulong)(bVar20 | p_Var12 == p_Var11);
          }
LAB_002c6675:
          std::__cxx11::string::~string((string *)&binaryDir);
        }
        else {
          binaryDir._M_dataplus._M_p._1_1_ = 0;
          uVar8 = (**(code **)(*(long *)p_Var10 + 0x10))
                            (p_Var10,&local_d8,
                             *(undefined4 *)(ppVar13[3].first.field_2._M_allocated_capacity + 0x20),
                             &binaryDir);
          local_1a0 = (_Base_ptr *)(ulong)uVar8;
          if ((char)uVar8 == '\0') {
            cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&ppVar13[1].second,state);
          }
          else {
            if (binaryDir._M_dataplus._M_p._1_1_ != '\0') {
              *(byte *)&ppVar13[0x13].second = (byte)binaryDir._M_dataplus._M_p;
              goto LAB_002c6374;
            }
            std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                      ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)this_00);
          }
        }
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
        ::~vector(&local_d8);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::~map(&cycleStatus);
        if (((ulong)local_1a0 & 1) == 0) {
LAB_002c66d5:
          cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)&ppVar13->second,state);
          goto LAB_002c60cb;
        }
LAB_002c669d:
      }
      p_Var10 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_002c66f2:
      if ((undefined1  [8])p_Var10 != local_a0) {
        if ((char)p_Var10[4]._M_color == _S_red) {
          iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                           *)local_b8,(key_type *)&p_Var10[8]._M_right);
          if (iVar14._M_node == (_Base_ptr)local_100._32_8_) {
            cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET((string *)(p_Var10 + 1),state);
            goto LAB_002c60cb;
          }
          sVar15 = std::
                   _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)&p_Var10[4]._M_parent[1]._M_parent,
                           (key_type *)&iVar14._M_node[4]._M_parent);
          if (sVar15 == 0) {
            cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                      ((string *)(p_Var10 + 1),state);
            goto LAB_002c60cb;
          }
          if ((*(char *)((long)&p_Var10[9]._M_right + 1) != '\x01') ||
             (((ulong)p_Var10[9]._M_right & 1) != 0)) {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::
            _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)&p_Var10[7]._M_parent,iVar14._M_node[8],
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )&iVar14._M_node[7]._M_left);
          }
        }
        pp_Var2 = &p_Var10[0xd]._M_parent;
        std::optional<cmCMakePresetsGraph::BuildPreset>::
        emplace<cmCMakePresetsGraph::BuildPreset_const&>
                  ((optional<cmCMakePresetsGraph::BuildPreset> *)pp_Var2,
                   (BuildPreset *)(p_Var10 + 2));
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var16 = p_Var10[0x13]._M_parent; p_Var16 != (_Base_ptr)&p_Var10[0x12]._M_right;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                   ::operator[](&cycleStatus,(key_type *)(p_Var16 + 1));
          *pmVar9 = Unvisited;
        }
        binaryDir._M_dataplus._M_p = (pointer)0x0;
        binaryDir._M_string_length = 0;
        binaryDir.field_2._M_allocated_capacity = 0;
        std::make_unique<cmCMakePresetsGraphInternal::BaseMacroExpander,cmCMakePresetsGraph&>
                  ((cmCMakePresetsGraph *)local_100);
        installDir._M_dataplus._M_p = (pointer)local_100._0_8_;
        local_100._0_8_ = (long *)0x0;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_100._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_100._0_8_ + 0x10))();
        }
        std::
        make_unique<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::BuildPreset>,cmCMakePresetsGraph&,cmCMakePresetsGraph::BuildPreset_const&>
                  ((cmCMakePresetsGraph *)local_100,(BuildPreset *)this);
        installDir._M_dataplus._M_p = (pointer)local_100._0_8_;
        local_100._0_8_ = (long *)0x0;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_100._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_100._0_8_ + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)operator_new(0x20);
        *(undefined ***)installDir._M_dataplus._M_p = &PTR_operator___0092cac0;
        *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          **)(installDir._M_dataplus._M_p + 8) = &cycleStatus;
        *(_Base_ptr **)(installDir._M_dataplus._M_p + 0x10) = pp_Var2;
        *(string **)(installDir._M_dataplus._M_p + 0x18) = &binaryDir;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        for (p_Var11 = p_Var10[0x13]._M_parent;
            p_Var11 != (_Rb_tree_node_base *)&p_Var10[0x12]._M_right;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          if ((char)p_Var11[3]._M_color == _S_black) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                     ::operator[](&cycleStatus,(key_type *)(p_Var11 + 1));
            EVar7 = anon_unknown.dwarf_bf9ea6::VisitEnv
                              ((string *)(p_Var11 + 2),pmVar9,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c6a44;
            if (EVar7 == Error) {
              cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var10[2]._M_parent,state);
              goto LAB_002c6aa7;
            }
          }
        }
        p_Var16 = p_Var10[6]._M_left;
        if (p_Var16 == (_Base_ptr)0x0) {
LAB_002c69bc:
          p_Var4 = p_Var10[0x15]._M_right;
          for (p_Var16 = p_Var10[0x15]._M_left; p_Var16 != p_Var4; p_Var16 = p_Var16 + 1) {
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)p_Var16,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c6a44;
            if (EVar7 == Error) goto LAB_002c6aa7;
          }
          p_Var4 = p_Var10[0x17]._M_right;
          for (p_Var16 = p_Var10[0x17]._M_left; p_Var16 != p_Var4; p_Var16 = p_Var16 + 1) {
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)p_Var16,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c6a44;
            if (EVar7 == Error) goto LAB_002c6aa7;
          }
          goto LAB_002c6a4c;
        }
        installDir._M_dataplus._M_p._1_1_ = 0;
        cVar6 = (**(code **)(*(long *)p_Var16 + 0x10))
                          (p_Var16,&binaryDir,p_Var10[4]._M_parent[1]._M_color,&installDir);
        if (cVar6 == '\0') {
          cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var10[2]._M_parent,state);
        }
        else {
          if (installDir._M_dataplus._M_p._1_1_ != '\0') {
            *(byte *)&p_Var10[0x12]._M_parent = (byte)installDir._M_dataplus._M_p;
            goto LAB_002c69bc;
          }
          std::_Optional_payload_base<cmCMakePresetsGraph::BuildPreset>::_M_reset
                    ((_Optional_payload_base<cmCMakePresetsGraph::BuildPreset> *)pp_Var2);
        }
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
        ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                   *)&binaryDir);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::~map(&cycleStatus);
        if (cVar6 != '\0') goto LAB_002c6a89;
        goto LAB_002c6abe;
      }
      for (p_Var10 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var10 != local_a8; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        if ((char)p_Var10[4]._M_color == _S_red) {
          iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                           *)local_b8,(key_type *)&p_Var10[8]._M_right);
          if (iVar14._M_node == (_Base_ptr)local_100._32_8_) {
            cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET((string *)(p_Var10 + 1),state);
            goto LAB_002c60cb;
          }
          sVar15 = std::
                   _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)&p_Var10[4]._M_parent[1]._M_parent,
                           (key_type *)&iVar14._M_node[4]._M_parent);
          if (sVar15 == 0) {
            cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                      ((string *)(p_Var10 + 1),state);
            goto LAB_002c60cb;
          }
          if ((*(char *)((long)&p_Var10[9]._M_right + 1) != '\x01') ||
             (((ulong)p_Var10[9]._M_right & 1) != 0)) {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::
            _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)&p_Var10[7]._M_parent,iVar14._M_node[8],
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )&iVar14._M_node[7]._M_left);
          }
        }
        pp_Var2 = &p_Var10[0x1e]._M_parent;
        std::optional<cmCMakePresetsGraph::TestPreset>::
        emplace<cmCMakePresetsGraph::TestPreset_const&>
                  ((optional<cmCMakePresetsGraph::TestPreset> *)pp_Var2,(TestPreset *)(p_Var10 + 2))
        ;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var16 = p_Var10[0x24]._M_parent; p_Var16 != (_Base_ptr)&p_Var10[0x23]._M_right;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                   ::operator[](&cycleStatus,(key_type *)(p_Var16 + 1));
          *pmVar9 = Unvisited;
        }
        binaryDir._M_dataplus._M_p = (pointer)0x0;
        binaryDir._M_string_length = 0;
        binaryDir.field_2._M_allocated_capacity = 0;
        std::make_unique<cmCMakePresetsGraphInternal::BaseMacroExpander,cmCMakePresetsGraph&>
                  ((cmCMakePresetsGraph *)local_100);
        installDir._M_dataplus._M_p = (pointer)local_100._0_8_;
        local_100._0_8_ = (long *)0x0;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_100._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_100._0_8_ + 0x10))();
        }
        std::
        make_unique<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::TestPreset>,cmCMakePresetsGraph&,cmCMakePresetsGraph::TestPreset_const&>
                  ((cmCMakePresetsGraph *)local_100,(TestPreset *)this);
        installDir._M_dataplus._M_p = (pointer)local_100._0_8_;
        local_100._0_8_ = (long *)0x0;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_100._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_100._0_8_ + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)operator_new(0x20);
        *(undefined ***)installDir._M_dataplus._M_p = &PTR_operator___0092cb00;
        *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          **)(installDir._M_dataplus._M_p + 8) = &cycleStatus;
        *(_Base_ptr **)(installDir._M_dataplus._M_p + 0x10) = pp_Var2;
        *(string **)(installDir._M_dataplus._M_p + 0x18) = &binaryDir;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        for (p_Var11 = p_Var10[0x24]._M_parent;
            p_Var11 != (_Rb_tree_node_base *)&p_Var10[0x23]._M_right;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          if ((char)p_Var11[3]._M_color == _S_black) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                     ::operator[](&cycleStatus,(key_type *)(p_Var11 + 1));
            EVar7 = anon_unknown.dwarf_bf9ea6::VisitEnv
                              ((string *)(p_Var11 + 2),pmVar9,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c702f;
            if (EVar7 == Error) {
              cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var10[2]._M_parent,state);
              goto LAB_002c7092;
            }
          }
        }
        p_Var16 = p_Var10[6]._M_left;
        if (p_Var16 == (_Base_ptr)0x0) {
LAB_002c6da7:
          p_Var4 = p_Var10[0x27]._M_left;
          for (p_Var16 = p_Var10[0x27]._M_parent; p_Var16 != p_Var4; p_Var16 = p_Var16 + 1) {
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)p_Var16,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c702f;
            if (EVar7 == Error) goto LAB_002c7092;
          }
          if ((char)p_Var10[0x2c]._M_color == _S_black) {
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)&p_Var10[0x28]._M_right,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) {
LAB_002c702f:
              std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset>::_M_reset
                        ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset> *)pp_Var2);
LAB_002c7037:
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)&binaryDir);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::~map(&cycleStatus);
              goto LAB_002c7074;
            }
            if (EVar7 != Error) {
              EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                ((string *)&p_Var10[0x29]._M_right,(MacroExpanderVector *)&binaryDir
                                 ,p_Var10[4]._M_parent[1]._M_color);
              if (EVar7 == Ignore) goto LAB_002c702f;
              if (EVar7 != Error) goto LAB_002c6e60;
            }
          }
          else {
LAB_002c6e60:
            if ((char)p_Var10[0x37]._M_color != _S_black) goto LAB_002c6ffe;
            if (*(char *)&p_Var10[0x31]._M_parent != '\x01') goto LAB_002c6f0d;
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)&p_Var10[0x2c]._M_parent,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c702f;
            if (EVar7 == Error) goto LAB_002c7092;
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)&p_Var10[0x2d]._M_parent,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c702f;
            if (EVar7 != Error) {
              if (*(char *)&p_Var10[0x30]._M_right == '\x01') {
                EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                  ((string *)&p_Var10[0x2f]._M_right,
                                   (MacroExpanderVector *)&binaryDir,
                                   p_Var10[4]._M_parent[1]._M_color);
                if (EVar7 == Ignore) goto LAB_002c702f;
                if (EVar7 == Error) goto LAB_002c7092;
              }
LAB_002c6f0d:
              if (*(char *)&p_Var10[0x36]._M_right != '\x01') {
LAB_002c6ffe:
                if (*(char *)&p_Var10[0x3a]._M_parent == '\x01') {
                  EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                    ((string *)&p_Var10[0x37]._M_right,
                                     (MacroExpanderVector *)&binaryDir,
                                     p_Var10[4]._M_parent[1]._M_color);
                  if (EVar7 == Ignore) goto LAB_002c702f;
                  if (EVar7 == Error) goto LAB_002c7092;
                }
                goto LAB_002c7037;
              }
              EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                ((string *)&p_Var10[0x31]._M_left,(MacroExpanderVector *)&binaryDir,
                                 p_Var10[4]._M_parent[1]._M_color);
              if (EVar7 == Ignore) goto LAB_002c702f;
              if (EVar7 != Error) {
                EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                  ((string *)&p_Var10[0x32]._M_left,
                                   (MacroExpanderVector *)&binaryDir,
                                   p_Var10[4]._M_parent[1]._M_color);
                if (EVar7 == Ignore) goto LAB_002c702f;
                if (EVar7 != Error) {
                  if (*(char *)&p_Var10[0x36]._M_left != '\x01') goto LAB_002c6ffe;
                  EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                    ((string *)&p_Var10[0x33]._M_left,
                                     (MacroExpanderVector *)&binaryDir,
                                     p_Var10[4]._M_parent[1]._M_color);
                  if (EVar7 == Ignore) goto LAB_002c702f;
                  if (EVar7 != Error) {
                    EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                      ((string *)&p_Var10[0x34]._M_left,
                                       (MacroExpanderVector *)&binaryDir,
                                       p_Var10[4]._M_parent[1]._M_color);
                    if (EVar7 == Ignore) goto LAB_002c702f;
                    if (EVar7 != Error) {
                      EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                                        ((string *)&p_Var10[0x35]._M_left,
                                         (MacroExpanderVector *)&binaryDir,
                                         p_Var10[4]._M_parent[1]._M_color);
                      if (EVar7 == Ignore) goto LAB_002c702f;
                      if (EVar7 != Error) goto LAB_002c6ffe;
                    }
                  }
                }
              }
            }
          }
LAB_002c7092:
          std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
          ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                     *)&binaryDir);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::~map(&cycleStatus);
LAB_002c70a9:
          cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var10 + 1),state);
          goto LAB_002c60cb;
        }
        installDir._M_dataplus._M_p._1_1_ = 0;
        cVar6 = (**(code **)(*(long *)p_Var16 + 0x10))
                          (p_Var16,&binaryDir,p_Var10[4]._M_parent[1]._M_color,&installDir);
        if (cVar6 == '\0') {
          cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var10[2]._M_parent,state);
        }
        else {
          if (installDir._M_dataplus._M_p._1_1_ != '\0') {
            *(byte *)&p_Var10[0x23]._M_parent = (byte)installDir._M_dataplus._M_p;
            goto LAB_002c6da7;
          }
          std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset>::_M_reset
                    ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset> *)pp_Var2);
        }
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
        ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                   *)&binaryDir);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
        ::~map(&cycleStatus);
        if (cVar6 == '\0') goto LAB_002c70a9;
LAB_002c7074:
      }
      for (p_Var10 = (this->PackagePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var10 != (_Base_ptr)local_b0._M_p; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)
          ) {
        if ((char)p_Var10[4]._M_color == _S_red) {
          iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                           *)local_b8,(key_type *)&p_Var10[8]._M_right);
          if (iVar14._M_node == (_Base_ptr)local_100._32_8_) {
            cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET((string *)(p_Var10 + 1),state);
            goto LAB_002c60cb;
          }
          sVar15 = std::
                   _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)&p_Var10[4]._M_parent[1]._M_parent,
                           (key_type *)&iVar14._M_node[4]._M_parent);
          if (sVar15 == 0) {
            cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                      ((string *)(p_Var10 + 1),state);
            goto LAB_002c60cb;
          }
          if ((*(char *)((long)&p_Var10[9]._M_right + 1) != '\x01') ||
             (((ulong)p_Var10[9]._M_right & 1) != 0)) {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::
            _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)&p_Var10[7]._M_parent,iVar14._M_node[8],
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )&iVar14._M_node[7]._M_left);
          }
        }
        pp_Var2 = &p_Var10[0x12]._M_parent;
        std::optional<cmCMakePresetsGraph::PackagePreset>::
        emplace<cmCMakePresetsGraph::PackagePreset_const&>
                  ((optional<cmCMakePresetsGraph::PackagePreset> *)pp_Var2,
                   (PackagePreset *)(p_Var10 + 2));
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var16 = p_Var10[0x18]._M_parent; p_Var16 != (_Base_ptr)&p_Var10[0x17]._M_right;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                   ::operator[](&cycleStatus,(key_type *)(p_Var16 + 1));
          *pmVar9 = Unvisited;
        }
        binaryDir._M_dataplus._M_p = (pointer)0x0;
        binaryDir._M_string_length = 0;
        binaryDir.field_2._M_allocated_capacity = 0;
        std::make_unique<cmCMakePresetsGraphInternal::BaseMacroExpander,cmCMakePresetsGraph&>
                  ((cmCMakePresetsGraph *)local_100);
        installDir._M_dataplus._M_p = (pointer)local_100._0_8_;
        local_100._0_8_ = (long *)0x0;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_100._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_100._0_8_ + 0x10))();
        }
        std::
        make_unique<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::PackagePreset>,cmCMakePresetsGraph&,cmCMakePresetsGraph::PackagePreset_const&>
                  ((cmCMakePresetsGraph *)local_100,(PackagePreset *)this);
        installDir._M_dataplus._M_p = (pointer)local_100._0_8_;
        local_100._0_8_ = (long *)0x0;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_100._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_100._0_8_ + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)operator_new(0x20);
        *(undefined ***)installDir._M_dataplus._M_p = &PTR_operator___0092cb40;
        *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          **)(installDir._M_dataplus._M_p + 8) = &cycleStatus;
        *(_Base_ptr **)(installDir._M_dataplus._M_p + 0x10) = pp_Var2;
        *(string **)(installDir._M_dataplus._M_p + 0x18) = &binaryDir;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        for (p_Var11 = p_Var10[0x18]._M_parent;
            p_Var11 != (_Rb_tree_node_base *)&p_Var10[0x17]._M_right;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          if ((char)p_Var11[3]._M_color == _S_black) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                     ::operator[](&cycleStatus,(key_type *)(p_Var11 + 1));
            EVar7 = anon_unknown.dwarf_bf9ea6::VisitEnv
                              ((string *)(p_Var11 + 2),pmVar9,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c74e2;
            if (EVar7 == Error) {
              cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var10[2]._M_parent,state);
              goto LAB_002c7545;
            }
          }
        }
        p_Var16 = p_Var10[6]._M_left;
        if (p_Var16 == (_Base_ptr)0x0) {
LAB_002c73bc:
          for (p_Var16 = p_Var10[0x1c]._M_left; _Var3 = p_Var10[4]._M_parent[1]._M_color,
              p_Var16 != p_Var10 + 0x1c; p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)(p_Var16 + 2),(MacroExpanderVector *)&binaryDir,_Var3);
            if (EVar7 == Ignore) goto LAB_002c74e2;
            if (EVar7 == Error) goto LAB_002c7545;
          }
          EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                            ((string *)&p_Var10[0x1d]._M_parent,(MacroExpanderVector *)&binaryDir,
                             _Var3);
          if (EVar7 == Ignore) {
LAB_002c74e2:
            std::_Optional_payload_base<cmCMakePresetsGraph::PackagePreset>::_M_reset
                      ((_Optional_payload_base<cmCMakePresetsGraph::PackagePreset> *)pp_Var2);
          }
          else {
            if (EVar7 == Error) {
LAB_002c7545:
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)&binaryDir);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::~map(&cycleStatus);
              goto LAB_002c755c;
            }
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)&p_Var10[0x1e]._M_left,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c74e2;
            if (EVar7 == Error) goto LAB_002c7545;
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)&p_Var10[0x1f]._M_left,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c74e2;
            if (EVar7 == Error) goto LAB_002c7545;
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)&p_Var10[0x20]._M_left,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c74e2;
            if (EVar7 == Error) goto LAB_002c7545;
            EVar7 = cmCMakePresetsGraphInternal::ExpandMacros
                              ((string *)&p_Var10[0x21]._M_left,(MacroExpanderVector *)&binaryDir,
                               p_Var10[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) goto LAB_002c74e2;
            if (EVar7 == Error) goto LAB_002c7545;
          }
          std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
          ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                     *)&binaryDir);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::~map(&cycleStatus);
        }
        else {
          installDir._M_dataplus._M_p._1_1_ = 0;
          cVar6 = (**(code **)(*(long *)p_Var16 + 0x10))
                            (p_Var16,&binaryDir,p_Var10[4]._M_parent[1]._M_color,&installDir);
          if (cVar6 == '\0') {
            cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var10[2]._M_parent,state);
          }
          else {
            if (installDir._M_dataplus._M_p._1_1_ != '\0') {
              *(byte *)&p_Var10[0x17]._M_parent = (byte)installDir._M_dataplus._M_p;
              goto LAB_002c73bc;
            }
            std::_Optional_payload_base<cmCMakePresetsGraph::PackagePreset>::_M_reset
                      ((_Optional_payload_base<cmCMakePresetsGraph::PackagePreset> *)pp_Var2);
          }
          std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
          ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                     *)&binaryDir);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::~map(&cycleStatus);
          if (cVar6 == '\0') {
LAB_002c755c:
            cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var10 + 1),state);
            goto LAB_002c60cb;
          }
        }
      }
      for (p_Var11 = (this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var11 != p_Var1;
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        p_Var10 = p_Var11[8]._M_right;
        p_Var16 = *(_Base_ptr *)(p_Var11 + 9);
        local_178 = (pointer)0x0;
LAB_002c7604:
        if (p_Var10 != p_Var16) {
          _Var3 = p_Var10->_M_color;
          if ((local_178 == (pointer)0x0) && (_Var3 != _S_red)) {
            cmCMakePresetsErrors::FIRST_WORKFLOW_STEP_NOT_CONFIGURE
                      ((string *)&p_Var10->_M_parent,state);
          }
          else {
            if ((local_178 != (pointer)0x0) && (_Var3 == _S_red)) {
              cmCMakePresetsErrors::CONFIGURE_WORKFLOW_STEP_NOT_FIRST
                        ((string *)&p_Var10->_M_parent,state);
              goto LAB_002c60cb;
            }
            switch(_Var3) {
            case _S_red:
              cVar17 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                               *)local_b8,(key_type *)&p_Var10->_M_parent);
              if (cVar17._M_node != (_Base_ptr)local_100._32_8_) {
                sVar15 = std::
                         _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)&p_Var11[4]._M_parent[1]._M_parent,
                                 (key_type *)&cVar17._M_node[4]._M_parent);
                if (sVar15 != 0) {
                  local_178 = (pointer)(cVar17._M_node + 2);
                  goto switchD_002c7649_default;
                }
LAB_002c7af2:
                cmCMakePresetsErrors::WORKFLOW_STEP_UNREACHABLE_FROM_FILE
                          ((string *)&p_Var10->_M_parent,state);
                goto LAB_002c60cb;
              }
              break;
            case _S_black:
              cVar18._M_node =
                   (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                   ::find(&(this->BuildPresets)._M_t,(key_type *)&p_Var10->_M_parent);
              if ((undefined1  [8])cVar18._M_node == local_a0) break;
              sVar15 = std::
                       _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)&p_Var11[4]._M_parent[1]._M_parent,
                               (key_type *)&cVar18._M_node[4]._M_parent);
LAB_002c7776:
              if (sVar15 == 0) goto LAB_002c7af2;
              psVar19 = (string *)&(local_178->first)._M_string_length;
              bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&cVar18._M_node[8]._M_right,psVar19);
              if (!bVar5) goto switchD_002c7649_default;
              goto LAB_002c7ae0;
            case 2:
              cVar18._M_node =
                   (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                   ::find(&(this->TestPresets)._M_t,(key_type *)&p_Var10->_M_parent);
              if (cVar18._M_node != local_a8) {
                sVar15 = std::
                         _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)&p_Var11[4]._M_parent[1]._M_parent,
                                 (key_type *)&cVar18._M_node[4]._M_parent);
                goto LAB_002c7776;
              }
              break;
            case 3:
              cVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                       ::find(&(this->PackagePresets)._M_t,(key_type *)&p_Var10->_M_parent);
              if (cVar18._M_node != (_Base_ptr)local_b0._M_p) {
                sVar15 = std::
                         _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)&p_Var11[4]._M_parent[1]._M_parent,
                                 (key_type *)&cVar18._M_node[4]._M_parent);
                goto LAB_002c7776;
              }
              break;
            default:
              goto switchD_002c7649_default;
            }
            psVar19 = (string *)&p_Var10->_M_parent;
LAB_002c7ae0:
            cmCMakePresetsErrors::INVALID_WORKFLOW_STEPS(psVar19,state);
          }
          goto LAB_002c60cb;
        }
        if (local_178 == (pointer)0x0) {
          cmCMakePresetsErrors::NO_WORKFLOW_STEPS((string *)(p_Var11 + 1),state);
          goto LAB_002c60cb;
        }
        pp_Var2 = &p_Var11[9]._M_left;
        std::optional<cmCMakePresetsGraph::WorkflowPreset>::
        emplace<cmCMakePresetsGraph::WorkflowPreset_const&>
                  ((optional<cmCMakePresetsGraph::WorkflowPreset> *)pp_Var2,
                   (WorkflowPreset *)(p_Var11 + 2));
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var10 = p_Var11[0xf]._M_left; p_Var10 != p_Var11 + 0xf;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                   ::operator[](&cycleStatus,(key_type *)(p_Var10 + 1));
          *pmVar9 = Unvisited;
        }
        binaryDir._M_dataplus._M_p = (pointer)0x0;
        binaryDir._M_string_length = 0;
        binaryDir.field_2._M_allocated_capacity = 0;
        std::make_unique<cmCMakePresetsGraphInternal::BaseMacroExpander,cmCMakePresetsGraph&>
                  ((cmCMakePresetsGraph *)local_100);
        installDir._M_dataplus._M_p = (pointer)local_100._0_8_;
        local_100._0_8_ = (long *)0x0;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_100._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_100._0_8_ + 0x10))();
        }
        std::
        make_unique<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,cmCMakePresetsGraph&,cmCMakePresetsGraph::WorkflowPreset_const&>
                  ((cmCMakePresetsGraph *)local_100,(WorkflowPreset *)this);
        installDir._M_dataplus._M_p = (pointer)local_100._0_8_;
        local_100._0_8_ = (long *)0x0;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_100._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_100._0_8_ + 0x10))();
        }
        installDir._M_dataplus._M_p = (pointer)operator_new(0x20);
        *(undefined ***)installDir._M_dataplus._M_p = &PTR_operator___0092cb80;
        *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          **)(installDir._M_dataplus._M_p + 8) = &cycleStatus;
        *(_Base_ptr **)(installDir._M_dataplus._M_p + 0x10) = pp_Var2;
        *(string **)(installDir._M_dataplus._M_p + 0x18) = &binaryDir;
        std::
        vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
        ::
        emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                  ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                    *)&binaryDir,
                   (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                    *)&installDir);
        if (installDir._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)installDir._M_dataplus._M_p + 0x10))();
        }
        for (p_Var10 = p_Var11[0xf]._M_left; p_Var10 != p_Var11 + 0xf;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          if ((char)p_Var10[3]._M_color == _S_black) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                     ::operator[](&cycleStatus,(key_type *)(p_Var10 + 1));
            EVar7 = anon_unknown.dwarf_bf9ea6::VisitEnv
                              ((string *)(p_Var10 + 2),pmVar9,(MacroExpanderVector *)&binaryDir,
                               p_Var11[4]._M_parent[1]._M_color);
            if (EVar7 == Ignore) {
              std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
                        ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)pp_Var2);
              goto LAB_002c7a1c;
            }
            if (EVar7 == Error) {
              cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var11[2]._M_parent,state);
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)&binaryDir);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::~map(&cycleStatus);
              goto LAB_002c7b2e;
            }
          }
        }
        p_Var10 = p_Var11[6]._M_left;
        if (p_Var10 == (_Base_ptr)0x0) {
LAB_002c7a1c:
          std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
          ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                     *)&binaryDir);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::~map(&cycleStatus);
        }
        else {
          installDir._M_dataplus._M_p._1_1_ = 0;
          cVar6 = (**(code **)(*(long *)p_Var10 + 0x10))
                            (p_Var10,&binaryDir,p_Var11[4]._M_parent[1]._M_color,&installDir);
          if (cVar6 == '\0') {
            cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var11[2]._M_parent,state);
          }
          else {
            if (installDir._M_dataplus._M_p._1_1_ != '\0') {
              *(byte *)&p_Var11[0xe]._M_left = (byte)installDir._M_dataplus._M_p;
              goto LAB_002c7a1c;
            }
            std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
                      ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)pp_Var2);
          }
          std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
          ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                     *)&binaryDir);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::~map(&cycleStatus);
          if (cVar6 == '\0') {
LAB_002c7b2e:
            cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var11 + 1),state);
            goto LAB_002c60cb;
          }
        }
      }
      bVar5 = true;
      goto LAB_002c60cd;
    }
  }
  goto LAB_002c60cb;
LAB_002c6a44:
  std::_Optional_payload_base<cmCMakePresetsGraph::BuildPreset>::_M_reset
            ((_Optional_payload_base<cmCMakePresetsGraph::BuildPreset> *)pp_Var2);
LAB_002c6a4c:
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
             *)&binaryDir);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(&cycleStatus);
LAB_002c6a89:
  p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
  goto LAB_002c66f2;
LAB_002c6aa7:
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
             *)&binaryDir);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(&cycleStatus);
LAB_002c6abe:
  cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var10 + 1),state);
  goto LAB_002c60cb;
switchD_002c7649_default:
  p_Var10 = (_Base_ptr)&p_Var10[1]._M_parent;
  goto LAB_002c7604;
LAB_002c60be:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(&cycleStatus);
LAB_002c60cb:
  bVar5 = false;
LAB_002c60cd:
  std::_Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>::
  ~_Vector_base(&inProgressFiles.
                 super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
               );
  std::__cxx11::string::~string((string *)&filename);
  return bVar5;
}

Assistant:

bool cmCMakePresetsGraph::ReadProjectPresetsInternal(bool allowNoFiles)
{
  bool haveOneFile = false;

  File* file;
  std::string filename = GetUserFilename(this->SourceDir);
  std::vector<File*> inProgressFiles;
  if (cmSystemTools::FileExists(filename)) {
    if (!this->ReadJSONFile(filename, RootType::User, ReadReason::Root,
                            inProgressFiles, file, this->errors)) {
      return false;
    }
    haveOneFile = true;
  } else {
    filename = GetFilename(this->SourceDir);
    if (cmSystemTools::FileExists(filename)) {
      if (!this->ReadJSONFile(filename, RootType::Project, ReadReason::Root,
                              inProgressFiles, file, this->errors)) {
        return false;
      }
      haveOneFile = true;
    }
  }
  assert(inProgressFiles.empty());

  if (!haveOneFile) {
    if (allowNoFiles) {
      return true;
    }
    cmCMakePresetsErrors::FILE_NOT_FOUND(filename, &this->parseState);
    return false;
  }

  bool result = ComputePresetInheritance(this->ConfigurePresets, *this) &&
    ComputePresetInheritance(this->ConfigurePresets, *this) &&
    ComputePresetInheritance(this->BuildPresets, *this) &&
    ComputePresetInheritance(this->TestPresets, *this) &&
    ComputePresetInheritance(this->PackagePresets, *this) &&
    ComputePresetInheritance(this->WorkflowPresets, *this);
  if (!result) {
    return false;
  }

  for (auto& it : this->ConfigurePresets) {
    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->BuildPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->TestPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->PackagePresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->WorkflowPresets) {
    using Type = WorkflowPreset::WorkflowStep::Type;

    const ConfigurePreset* configurePreset = nullptr;
    for (auto const& step : it.second.Unexpanded.Steps) {
      if (configurePreset == nullptr && step.PresetType != Type::Configure) {
        cmCMakePresetsErrors::FIRST_WORKFLOW_STEP_NOT_CONFIGURE(
          step.PresetName, &this->parseState);
        return false;
      }
      if (configurePreset != nullptr && step.PresetType == Type::Configure) {
        cmCMakePresetsErrors::CONFIGURE_WORKFLOW_STEP_NOT_FIRST(
          step.PresetName, &this->parseState);
        return false;
      }

      switch (step.PresetType) {
        case Type::Configure:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->ConfigurePresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Build:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->BuildPresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Test:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->TestPresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Package:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->PackagePresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
      }
      if (!result) {
        return false;
      }
    }

    if (configurePreset == nullptr) {
      cmCMakePresetsErrors::NO_WORKFLOW_STEPS(it.first, &this->parseState);
      return false;
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  return true;
}